

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::fpToString<double>(double value,int precision)

{
  ostream *this;
  void *this_00;
  long lVar1;
  long lVar2;
  char *pcVar3;
  int in_ESI;
  string *in_RDI;
  double in_XMM0_Qa;
  size_t i;
  ostringstream oss;
  string *d;
  string local_1d0 [32];
  long local_1b0;
  undefined1 local_1a5;
  int local_194;
  ostringstream local_190 [380];
  int local_14;
  double local_10;
  
  local_14 = in_ESI;
  local_10 = in_XMM0_Qa;
  std::__cxx11::ostringstream::ostringstream(local_190);
  local_194 = (int)std::setprecision(local_14);
  this = std::operator<<((ostream *)local_190,(_Setprecision)local_194);
  this_00 = (void *)std::ostream::operator<<(this,std::fixed);
  std::ostream::operator<<(this_00,local_10);
  local_1a5 = 0;
  std::__cxx11::ostringstream::str();
  lVar1 = std::__cxx11::string::find_last_not_of((char)in_RDI,0x30);
  local_1b0 = lVar1;
  if ((lVar1 != -1) && (lVar2 = std::__cxx11::string::size(), lVar1 != lVar2 + -1)) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
    if (*pcVar3 == '.') {
      local_1b0 = local_1b0 + 1;
    }
    std::__cxx11::string::substr((ulong)local_1d0,(ulong)in_RDI);
    std::__cxx11::string::operator=(in_RDI,local_1d0);
    std::__cxx11::string::~string(local_1d0);
  }
  local_1a5 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

std::string fpToString( T value, int precision ) {
    std::ostringstream oss;
    oss << std::setprecision( precision )
        << std::fixed
        << value;
    std::string d = oss.str();
    std::size_t i = d.find_last_not_of( '0' );
    if( i != std::string::npos && i != d.size()-1 ) {
        if( d[i] == '.' )
            i++;
        d = d.substr( 0, i+1 );
    }
    return d;
}